

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.c
# Opt level: O2

int lgx_co_delete(lgx_vm_t *vm,lgx_co_t *co)

{
  lgx_co_t *plVar1;
  lgx_list_s *plVar2;
  
  plVar1 = (lgx_co_t *)(co->head).next;
  if (plVar1 != co) {
    plVar2 = (co->head).prev;
    (plVar1->head).prev = plVar2;
    plVar2->next = (lgx_list_s *)plVar1;
  }
  lgx_co_stack_cleanup(&co->stack);
  free(co);
  vm->co_count = vm->co_count - 1;
  return 0;
}

Assistant:

int lgx_co_delete(lgx_vm_t *vm, lgx_co_t *co) {
    if (!lgx_list_empty(&co->head)) {
        lgx_list_del(&co->head);
    }

    lgx_co_stack_cleanup(&co->stack);
    xfree(co);

    vm->co_count --;

    return 0;
}